

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<double>::SolveSOR
          (TPZSkylMatrix<double> *this,int64_t *numiterations,TPZFMatrix<double> *F,
          TPZFMatrix<double> *result,TPZFMatrix<double> *residual,TPZFMatrix<double> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  double **ppdVar1;
  long lVar2;
  double dVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  double **ppdVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  long local_70;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  if (residual == (TPZFMatrix<double> *)0x0) {
    dVar21 = *tol + *tol + 1.0;
  }
  else {
    dVar21 = Dot<double>(residual,residual);
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  iVar7 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  lVar12 = CONCAT44(extraout_var,iVar7) + -1;
  lVar15 = 0;
  lVar6 = lVar15;
  if (direction != -1) {
    lVar12 = lVar15;
    lVar6 = CONCAT44(extraout_var,iVar7);
  }
  if ((0 < *numiterations) && (*tol <= dVar21 && dVar21 != *tol)) {
    lVar4 = (F->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    lVar2 = (ulong)(direction != -1) * 2 + -1;
    lVar15 = 0;
    do {
      TPZFMatrix<double>::operator=(scratch,F);
      dVar21 = 0.0;
      if (0 < lVar4) {
        local_70 = 0;
        lVar18 = 0;
        do {
          if (direction == 1) {
            if (lVar12 != lVar6) {
              ppdVar9 = (this->fElem).fStore;
              lVar16 = lVar12 * 8 + 8;
              lVar20 = lVar12;
              do {
                ppdVar1 = ppdVar9 + lVar20;
                lVar19 = (long)ppdVar9[lVar20 + 1] - (long)*ppdVar1;
                lVar13 = lVar19 >> 3;
                lVar8 = lVar20 - lVar13;
                if (((lVar8 < -1) ||
                    (lVar11 = (scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                    lVar11 <= lVar8 + 1)) ||
                   ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pdVar5 = scratch->fElem;
                if (((lVar20 < 0) ||
                    (lVar8 = (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                    lVar8 <= lVar20)) ||
                   ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                ppdVar9 = (this->fElem).fStore;
                pdVar10 = (double *)((long)ppdVar9[lVar20] + lVar19 + -8);
                lVar19 = (long)pdVar10 - (long)*ppdVar1 >> 3;
                if (-1 < lVar19) {
                  dVar22 = result->fElem[lVar8 * lVar18 + lVar20];
                  lVar8 = lVar11 * local_70 + lVar16 + lVar13 * -8;
                  lVar13 = 0;
                  do {
                    *(double *)((long)pdVar5 + lVar13 * 8 + lVar8) =
                         *(double *)((long)pdVar5 + lVar13 * 8 + lVar8) - *pdVar10 * dVar22;
                    lVar13 = lVar13 + 1;
                    pdVar10 = pdVar10 + -1;
                  } while (lVar19 + 1 != lVar13);
                }
                lVar20 = lVar20 + lVar2;
                lVar16 = lVar16 + lVar2 * 8;
                lVar8 = lVar12;
              } while (lVar20 != lVar6);
              for (; lVar8 != lVar6; lVar8 = lVar8 + lVar2) {
                ppdVar9 = (this->fElem).fStore;
                lVar16 = (long)ppdVar9[lVar8 + 1] - (long)ppdVar9[lVar8];
                if (((lVar8 < 0) ||
                    (lVar20 = (scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                    lVar20 <= lVar8)) ||
                   ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar13 = lVar16 >> 3;
                dVar22 = scratch->fElem[lVar20 * lVar18 + lVar8];
                lVar20 = (lVar8 - lVar13) + 1;
                if (((lVar8 - lVar13 < -1) ||
                    (lVar13 = (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                    lVar13 <= lVar20)) ||
                   ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pdVar5 = result->fElem;
                lVar19 = lVar13 * lVar18;
                pdVar10 = (this->fElem).fStore[lVar8];
                pdVar14 = (double *)((long)pdVar10 + lVar16 + -8);
                if (pdVar10 < pdVar14) {
                  pdVar17 = pdVar5 + lVar19 + lVar20;
                  do {
                    dVar3 = *pdVar17;
                    pdVar17 = pdVar17 + 1;
                    dVar22 = dVar22 - *pdVar14 * dVar3;
                    pdVar14 = pdVar14 + -1;
                  } while (pdVar10 < pdVar14);
                }
                if (((lVar8 < 0) || (lVar13 <= lVar8)) ||
                   ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar21 = dVar21 + ABS(dVar22 * dVar22);
                pdVar5[lVar19 + lVar8] = (dVar22 * overrelax) / *pdVar14 + pdVar5[lVar19 + lVar8];
              }
            }
          }
          else if (lVar12 != lVar6) {
            lVar16 = (scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            lVar20 = lVar12;
            do {
              ppdVar9 = (this->fElem).fStore;
              lVar8 = (long)ppdVar9[lVar20 + 1] - (long)ppdVar9[lVar20];
              if (((lVar20 < 0) || (lVar16 <= lVar20)) ||
                 ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar13 = lVar8 >> 3;
              dVar22 = scratch->fElem[lVar16 * lVar18 + lVar20];
              lVar16 = (lVar20 - lVar13) + 1;
              if (((lVar20 - lVar13 < -1) ||
                  (lVar13 = (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                  lVar13 <= lVar16)) ||
                 ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar5 = (this->fElem).fStore[lVar20];
              pdVar10 = (double *)((long)pdVar5 + lVar8 + -8);
              if (pdVar5 < pdVar10) {
                pdVar14 = result->fElem + lVar13 * lVar18 + lVar16;
                do {
                  dVar3 = *pdVar14;
                  pdVar14 = pdVar14 + 1;
                  dVar22 = dVar22 - *pdVar10 * dVar3;
                  pdVar10 = pdVar10 + -1;
                } while (pdVar5 < pdVar10);
              }
              if (((lVar20 < 0) ||
                  (lVar16 = (scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                  lVar16 <= lVar20)) ||
                 ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              scratch->fElem[lVar16 * lVar18 + lVar20] = dVar22;
              lVar20 = lVar20 + lVar2;
            } while (lVar20 != lVar6);
            if (lVar12 != lVar6) {
              ppdVar9 = (this->fElem).fStore;
              lVar16 = lVar12;
              do {
                pdVar5 = ppdVar9[lVar16];
                pdVar10 = ppdVar9[lVar16 + 1];
                lVar13 = (long)pdVar10 - (long)pdVar5 >> 3;
                lVar19 = (lVar16 - lVar13) + 1;
                lVar20 = (scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
                lVar8 = (scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
                if ((lVar8 <= lVar18 || lVar16 - lVar13 < -1) || lVar20 <= lVar19) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pdVar14 = scratch->fElem;
                if (((lVar16 < 0) || (lVar20 <= lVar16)) || (lVar8 <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar8 = (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
                lVar13 = (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
                if ((lVar13 <= lVar18 || lVar8 <= lVar16) || lVar16 < 0) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar11 = lVar8 * lVar18;
                pdVar17 = result->fElem;
                if (((lVar16 < 0) || (lVar8 <= lVar16)) || (lVar13 <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar22 = pdVar14[lVar20 * lVar18 + lVar16] - *pdVar5 * pdVar17[lVar11 + lVar16];
                pdVar17[lVar11 + lVar16] = (dVar22 * overrelax) / *pdVar5 + pdVar17[lVar11 + lVar16]
                ;
                if (((lVar16 < 0) || (lVar8 <= lVar16)) ||
                   ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                ppdVar9 = (this->fElem).fStore;
                pdVar10 = (double *)((long)ppdVar9[lVar16] + ((long)pdVar10 - (long)pdVar5) + -8);
                if (pdVar5 < pdVar10) {
                  pdVar14 = pdVar14 + lVar20 * lVar18 + lVar19;
                  dVar3 = pdVar17[lVar11 + lVar16];
                  do {
                    *pdVar14 = *pdVar14 - *pdVar10 * dVar3;
                    pdVar14 = pdVar14 + 1;
                    pdVar10 = pdVar10 + -1;
                  } while (pdVar5 < pdVar10);
                }
                dVar21 = dVar21 + ABS(dVar22 * dVar22);
                lVar16 = lVar16 + lVar2;
              } while (lVar16 != lVar6);
            }
          }
          lVar18 = lVar18 + 1;
          local_70 = local_70 + 8;
        } while (lVar18 != lVar4);
      }
      if (dVar21 < 0.0) {
        dVar21 = sqrt(dVar21);
      }
      else {
        dVar21 = SQRT(dVar21);
      }
      lVar15 = lVar15 + 1;
    } while ((lVar15 < *numiterations) && (*tol <= dVar21 && dVar21 != *tol));
  }
  if (residual != (TPZFMatrix<double> *)0x0) {
    (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x28])
              (this,result,F);
  }
  *numiterations = lVar15;
  *tol = dVar21;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}